

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

const_reference __thiscall
absl::
InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>_>
::at(InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>_>
     *this,size_type i)

{
  ulong uVar1;
  Rep *pRVar2;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if (i < uVar1 >> 1) {
    if ((uVar1 & 1) == 0) {
      pRVar2 = &this->rep_;
    }
    else {
      pRVar2 = *(Rep **)((long)&this->rep_ + 8);
    }
    return (const_reference)(i * 0x10 + (long)pRVar2);
  }
  base_internal::ThrowStdOutOfRange("InlinedVector::at() failed bounds check");
}

Assistant:

size_type size() const { return size_ / 2; }